

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O1

void Liby::Resolver::async_resolve(string *host,string *service,ResolverHandler *handler)

{
  int iVar1;
  EventLoop *loop;
  _Any_data local_60;
  _Manager_type local_50;
  ResolverThread *local_40;
  code *local_38;
  undefined8 local_30;
  
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::rt == '\0') {
    async_resolve();
  }
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::ri == '\0') {
    iVar1 = __cxa_guard_acquire(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                                 ::ri);
    if (iVar1 != 0) {
      async_resolve::ri.rt_ = &async_resolve::rt;
      local_38 = ResolverThread::func;
      local_30 = 0;
      local_40 = &async_resolve::rt;
      std::thread::thread<void(ResolverThread::*)(),ResolverThread*,void>
                (&async_resolve::ri.t_,(offset_in_ResolverThread_to_subr *)&local_38,&local_40);
      __cxa_atexit(ResolverImp::~ResolverImp,&async_resolve::ri,&__dso_handle);
      __cxa_guard_release(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                           ::ri);
    }
  }
  loop = EventLoop::curr_thread_loop();
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)> *)
           &local_60,handler);
  ResolverThread::resolve(&async_resolve::rt,host,service,loop,(ResolverHandler *)&local_60);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  return;
}

Assistant:

void Resolver::async_resolve(const std::string &host,
                             const std::string &service,
                             const ResolverHandler &handler) {
    static ResolverThread rt;
    static ResolverImp ri(rt);

    EventLoop *loop = EventLoop::curr_thread_loop();
    rt.resolve(host, service, loop, handler);
}